

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::HandleTable::Resize(HandleTable *this)

{
  LRUHandle *pLVar1;
  ulong uVar2;
  LRUHandle **__s;
  LRUHandle **ptr;
  uint32_t hash;
  LRUHandle *next;
  LRUHandle *h;
  uint32_t i;
  uint32_t count;
  LRUHandle **new_list;
  uint32_t new_length;
  HandleTable *this_local;
  
  for (new_list._4_4_ = 4; new_list._4_4_ < this->elems_; new_list._4_4_ = new_list._4_4_ << 1) {
  }
  uVar2 = SUB168(ZEXT416(new_list._4_4_) * ZEXT816(8),0);
  if (SUB168(ZEXT416(new_list._4_4_) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = (LRUHandle **)operator_new__(uVar2);
  memset(__s,0,(ulong)new_list._4_4_ << 3);
  h._4_4_ = 0;
  for (h._0_4_ = 0; (uint)h < this->length_; h._0_4_ = (uint)h + 1) {
    next = this->list_[(uint)h];
    while (next != (LRUHandle *)0x0) {
      pLVar1 = next->next_hash;
      next->next_hash = __s[next->hash & new_list._4_4_ - 1];
      __s[next->hash & new_list._4_4_ - 1] = next;
      h._4_4_ = h._4_4_ + 1;
      next = pLVar1;
    }
  }
  if (this->elems_ == h._4_4_) {
    if (this->list_ != (LRUHandle **)0x0) {
      operator_delete__(this->list_);
    }
    this->list_ = __s;
    this->length_ = new_list._4_4_;
    return;
  }
  __assert_fail("elems_ == count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0x8e,"void leveldb::(anonymous namespace)::HandleTable::Resize()");
}

Assistant:

void Resize() {
    uint32_t new_length = 4;
    while (new_length < elems_) {
      new_length *= 2;
    }
    LRUHandle** new_list = new LRUHandle*[new_length];
    memset(new_list, 0, sizeof(new_list[0]) * new_length);
    uint32_t count = 0;
    for (uint32_t i = 0; i < length_; i++) {
      LRUHandle* h = list_[i];
      while (h != nullptr) {
        LRUHandle* next = h->next_hash;
        uint32_t hash = h->hash;
        LRUHandle** ptr = &new_list[hash & (new_length - 1)];
        h->next_hash = *ptr;
        *ptr = h;
        h = next;
        count++;
      }
    }
    assert(elems_ == count);
    delete[] list_;
    list_ = new_list;
    length_ = new_length;
  }